

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O0

string * __thiscall
benchmark::ToBinaryStringFullySpecified_abi_cxx11_
          (string *__return_storage_ptr__,benchmark *this,double value,double threshold,
          int precision)

{
  undefined1 in_CL;
  string local_80;
  benchmark *local_50;
  int64_t exponent;
  string mantissa;
  int precision_local;
  double threshold_local;
  double value_local;
  
  mantissa.field_2._12_4_ = SUB84(this,0);
  std::__cxx11::string::string((string *)&exponent);
  ToExponentAndMantissa
            (value,threshold,mantissa.field_2._12_4_,1024.0,(string *)&exponent,(int64_t *)&local_50
            );
  ExponentToPrefix_abi_cxx11_(&local_80,local_50,0,(bool)in_CL);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exponent,
                 &local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&exponent);
  return __return_storage_ptr__;
}

Assistant:

std::string ToBinaryStringFullySpecified(double value, double threshold,
                                         int precision) {
  std::string mantissa;
  int64_t exponent;
  ToExponentAndMantissa(value, threshold, precision, 1024.0, &mantissa,
                        &exponent);
  return mantissa + ExponentToPrefix(exponent, false);
}